

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O0

void __thiscall Pl_RunLength::decode(Pl_RunLength *this,uchar *data,size_t len)

{
  byte bVar1;
  state_e sVar2;
  uint uVar3;
  long lVar4;
  runtime_error *this_00;
  pointer pMVar5;
  byte *pbVar6;
  pointer pMVar7;
  uchar *ch;
  size_t i;
  size_t len_local;
  uchar *data_local;
  Pl_RunLength *this_local;
  
  if ((anonymous_namespace)::memory_limit != 0) {
    std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::operator->
              (&this->m);
    lVar4 = std::__cxx11::string::size();
    if ((anonymous_namespace)::memory_limit < len + lVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Pl_RunLength memory limit exceeded");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  std::__cxx11::string::reserve((ulong)&pMVar5->out);
  for (ch = (uchar *)0x0; ch < len; ch = ch + 1) {
    pbVar6 = data + (long)ch;
    pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    sVar2 = pMVar5->state;
    if (sVar2 == st_top) {
      if (*pbVar6 < 0x80) {
        bVar1 = *pbVar6;
        pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar5->length = bVar1 + 1;
        pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar5->state = st_copying;
      }
      else if (0x80 < *pbVar6) {
        bVar1 = *pbVar6;
        pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar5->length = 0x101 - bVar1;
        pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar5->state = st_run;
      }
    }
    else if (sVar2 == st_copying) {
      pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      std::__cxx11::string::append((ulong)&pMVar5->out,'\x01');
      pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      uVar3 = pMVar5->length - 1;
      pMVar5->length = uVar3;
      if (uVar3 == 0) {
        pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m);
        pMVar5->state = st_top;
      }
    }
    else if (sVar2 == st_run) {
      pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar7 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      std::__cxx11::string::append((ulong)&pMVar5->out,(char)pMVar7->length);
      pMVar5 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar5->state = st_top;
    }
  }
  return;
}

Assistant:

void
Pl_RunLength::decode(unsigned char const* data, size_t len)
{
    if (memory_limit && (len + m->out.size()) > memory_limit) {
        throw std::runtime_error("Pl_RunLength memory limit exceeded");
    }
    m->out.reserve(len);
    for (size_t i = 0; i < len; ++i) {
        unsigned char const& ch = data[i];
        switch (m->state) {
        case st_top:
            if (ch < 128) {
                // length represents remaining number of bytes to copy
                m->length = 1U + ch;
                m->state = st_copying;
            } else if (ch > 128) {
                // length represents number of copies of next byte
                m->length = 257U - ch;
                m->state = st_run;
            } else // ch == 128
            {
                // EOD; stay in this state
            }
            break;

        case st_copying:
            m->out.append(1, static_cast<char>(ch));
            if (--m->length == 0) {
                m->state = st_top;
            }
            break;

        case st_run:
            m->out.append(m->length, static_cast<char>(ch));
            m->state = st_top;
            break;
        }
    }
}